

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

uchar * tf::detail::align_cacheline<unsigned_char,64ul>(uchar *p)

{
  uintptr_t ip;
  uchar *p_local;
  
  return (uchar *)((ulong)(p + 0x3f) & 0xffffffffffffffc0);
}

Assistant:

inline T* align_cacheline(T* p) {
#if defined(UINTPTR_MAX) && __cplusplus >= 201103L
  std::uintptr_t ip = reinterpret_cast<std::uintptr_t>(p);
#else
  std::size_t ip = reinterpret_cast<std::size_t>(p);
#endif
  //ip = (ip + cacheline_size - 1) & -cacheline_size;
  ip = (ip + cacheline_size - 1) & ~(cacheline_size - 1);
  return reinterpret_cast<T*>(ip);
}